

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.cpp
# Opt level: O0

void __thiscall hwnet::TCPSocket::doClose(TCPSocket *this)

{
  bool bVar1;
  enable_shared_from_this<hwnet::TCPSocket> local_58 [2];
  lock_guard<std::mutex> local_38;
  lock_guard<std::mutex> guard;
  CloseCallback callback;
  TCPSocket *this_local;
  
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)&guard,(nullptr_t)0x0);
  std::lock_guard<std::mutex>::lock_guard(&local_38,&this->mtx);
  bVar1 = std::function::operator_cast_to_bool((function *)&this->closeCallback_);
  if (bVar1) {
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator=
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)&guard,
               &this->closeCallback_);
  }
  linklist::clear(this->sendLists);
  linklist::clear(this->sendLists + 1);
  std::lock_guard<std::mutex>::~lock_guard(&local_38);
  bVar1 = std::function::operator_cast_to_bool((function *)&guard);
  if (bVar1) {
    std::enable_shared_from_this<hwnet::TCPSocket>::shared_from_this(local_58);
    std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::operator()
              ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)&guard,
               (shared_ptr<hwnet::TCPSocket> *)local_58);
    std::shared_ptr<hwnet::TCPSocket>::~shared_ptr((shared_ptr<hwnet::TCPSocket> *)local_58);
  }
  std::function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)>::~function
            ((function<void_(const_std::shared_ptr<hwnet::TCPSocket>_&)> *)&guard);
  return;
}

Assistant:

void TCPSocket::doClose() {
	CloseCallback callback = nullptr;
	{
		std::lock_guard<std::mutex> guard(this->mtx);
		if(closeCallback_){
			callback = closeCallback_;
		}
		sendLists[0].clear();
		sendLists[1].clear();
	}

	if(callback) {
		callback(shared_from_this());
	}
}